

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastpack18(uint32_t *in,uint32_t *out)

{
  *out = *in & 0x3ffff;
  Unroller<(unsigned_short)18,_(unsigned_short)1>::Pack(in,out);
  return;
}

Assistant:

void __fastpack18(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<18>::Pack(in, out);
}